

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O0

void __thiscall
TPZFileEqnStorage<std::complex<float>_>::Backward
          (TPZFileEqnStorage<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *f,
          DecomposeType dec)

{
  FILE *__stream;
  int64_t iVar1;
  FILE *inputfile;
  long *plVar2;
  TPZEqnArray<std::complex<float>_> *in_RDI;
  int64_t position;
  int64_t sizereturn;
  int i;
  TPZEqnArray<std::complex<float>_> REqnArray;
  TPZEqnArray<std::complex<float>_> *in_stack_ffffffffffffcd00;
  TPZEqnArray<std::complex<float>_> *in_stack_ffffffffffffcd30;
  int local_32ac;
  DecomposeType in_stack_ffffffffffffcd84;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffcd88;
  TPZEqnArray<std::complex<float>_> *in_stack_ffffffffffffcd90;
  
  TPZEqnArray<std::complex<float>_>::TPZEqnArray(in_stack_ffffffffffffcd30);
  iVar1 = TPZVec<long>::NElements
                    ((TPZVec<long> *)
                     &(in_RDI->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore);
  local_32ac = (int)iVar1;
  while (local_32ac = local_32ac + -1, -1 < local_32ac) {
    inputfile = (FILE *)TPZVec<long>::operator[]
                                  ((TPZVec<long> *)
                                   &(in_RDI->fEqStart).super_TPZManVector<int,_100>.
                                    super_TPZVec<int>.fStore,(long)local_32ac);
    if (*(long *)inputfile != 0) {
      __stream = *(FILE **)((in_RDI->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + 0x1e);
      plVar2 = TPZVec<long>::operator[]
                         ((TPZVec<long> *)
                          &(in_RDI->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore,
                          (long)local_32ac);
      fseek(__stream,*plVar2,0);
      in_stack_ffffffffffffcd00 =
           (TPZEqnArray<std::complex<float>_> *)
           fread(&stack0xffffffffffffcd30,8,1,
                 *(FILE **)((in_RDI->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + 0x1e));
      fseek(*(FILE **)((in_RDI->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + 0x1e),
            (long)in_stack_ffffffffffffcd30,0);
      TPZEqnArray<std::complex<float>_>::Read(in_RDI,inputfile);
      TPZEqnArray<std::complex<float>_>::EqnBackward
                (in_stack_ffffffffffffcd90,in_stack_ffffffffffffcd88,in_stack_ffffffffffffcd84);
    }
  }
  TPZEqnArray<std::complex<float>_>::~TPZEqnArray(in_stack_ffffffffffffcd00);
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::Backward(TPZFMatrix<TVar> &f, DecomposeType dec) const
{
	TPZEqnArray<TVar> REqnArray;
	int i;
	int64_t sizereturn;
	sizereturn = 0;
	for(i=fBlockPos.NElements()-1;i>=0;i--){
		if (fBlockPos[i]) {
			fseek(fIOStream,fBlockPos[i],SEEK_SET);
			int64_t position;
			sizereturn = fread(&position,sizeof(int64_t),1,fIOStream);
#ifdef PZDEBUG
			if (sizereturn != 1) DebugStop();
#endif
			fseek(fIOStream,position,SEEK_SET);
			REqnArray.Read(fIOStream);
			REqnArray.EqnBackward(f,dec); 
		}
	}
}